

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

shared_ptr<cppnet::Log> __thiscall cppnet::BaseLogger::GetLog(BaseLogger *this)

{
  Log *pLVar1;
  bool bVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BaseLogger *in_RSI;
  shared_ptr<cppnet::Log> sVar4;
  __allocator_type __a2;
  Log *log;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<cppnet::Log_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhiyi[P]CppNet_common_log_base_logger_cpp:191:20),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_28;
  
  log = (Log *)0x0;
  bVar2 = ThreadSafeQueue<cppnet::Log_*>::Pop(&in_RSI->_cache_queue,&log);
  if (!bVar2) {
    log = NewLog(in_RSI);
  }
  pLVar1 = log;
  *(Log **)this = log;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  peVar3 = (element_type *)operator_new(0x20);
  local_28._M_alloc = &__a2;
  peVar3[1]._vptr_Alloter = (_func_int **)0x100000001;
  peVar3->_vptr_Alloter = (_func_int **)&PTR___Sp_counted_base_00129d30;
  peVar3[2]._vptr_Alloter = (_func_int **)in_RSI;
  peVar3[3]._vptr_Alloter = (_func_int **)pLVar1;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  local_28._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<cppnet::Log_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/common/log/base_logger.cpp:191:20),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_28);
  sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<cppnet::Log>)sVar4.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Log> BaseLogger::GetLog() {
    Log* log = nullptr;
    if (_cache_queue.Pop(log)) {

    } else {
        log = NewLog();
    }

    auto deleter = [this](Log *l) { FreeLog(l); };

    return std::shared_ptr<Log>(log, deleter);
}